

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_buffer.cpp
# Opt level: O0

tuple<const_char_*,_long> __thiscall ReadBuffer::get_chars(ReadBuffer *this,ssize_t n)

{
  long in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  _Head_base<0UL,_const_char_*,_false> _Var1;
  tuple<const_char_*,_long> tVar2;
  long local_70;
  undefined1 local_68 [8];
  tuple<char_*,_long> result_1;
  undefined1 local_50 [8];
  tuple<char_*,_long> result;
  int local_38 [2];
  tuple<std::nullptr_t,_int> local_30;
  long local_20;
  ssize_t n_local;
  ReadBuffer *this_local;
  
  n_local = n;
  this_local = this;
  if (*(long *)(n + 0x18) == *(long *)(n + 0x10)) {
    local_38[0] = 0;
    local_38[1] = 0;
    result.super__Tuple_impl<0UL,_char_*,_long>.super__Head_base<0UL,_char_*,_false>._M_head_impl.
    _4_4_ = 0;
    std::make_tuple<decltype(nullptr),int>((void **)&local_30,local_38);
    std::tuple<const_char_*,_long>::tuple<std::nullptr_t,_int,_true>
              ((tuple<const_char_*,_long> *)this,&local_30);
    _Var1._M_head_impl = extraout_RDX;
  }
  else if (*(long *)(n + 0x18) - *(long *)(n + 0x10) < in_RDX) {
    local_70 = *(long *)n + *(long *)(n + 0x10);
    std::make_tuple<char*,long>((char **)local_68,&local_70);
    *(undefined8 *)(n + 0x10) = 0;
    *(undefined8 *)(n + 0x18) = 0;
    std::tuple<const_char_*,_long>::tuple<char_*,_long,_true>
              ((tuple<const_char_*,_long> *)this,(tuple<char_*,_long> *)local_68);
    _Var1._M_head_impl = extraout_RDX_01;
  }
  else {
    result_1.super__Tuple_impl<0UL,_char_*,_long>.super__Head_base<0UL,_char_*,_false>._M_head_impl
         = (char *)(*(long *)n + *(long *)(n + 0x10));
    local_20 = in_RDX;
    std::make_tuple<char*,long&>
              ((char **)local_50,
               (long *)&result_1.super__Tuple_impl<0UL,_char_*,_long>.
                        super__Head_base<0UL,_char_*,_false>);
    *(long *)(n + 0x10) = local_20 + *(long *)(n + 0x10);
    std::tuple<const_char_*,_long>::tuple<char_*,_long,_true>
              ((tuple<const_char_*,_long> *)this,(tuple<char_*,_long> *)local_50);
    _Var1._M_head_impl = extraout_RDX_00;
  }
  tVar2.super__Tuple_impl<0UL,_const_char_*,_long>.super__Head_base<0UL,_const_char_*,_false>.
  _M_head_impl = _Var1._M_head_impl;
  tVar2.super__Tuple_impl<0UL,_const_char_*,_long>.super__Tuple_impl<1UL,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl =
       (_Head_base<1UL,_long,_false>)(_Head_base<1UL,_long,_false>)this;
  return (tuple<const_char_*,_long>)tVar2.super__Tuple_impl<0UL,_const_char_*,_long>;
}

Assistant:

std::tuple<const char *, ssize_t> ReadBuffer::get_chars(ssize_t n) {
    if (this->right == this->left) {
        return std::make_tuple(nullptr, 0);
    }
    if (this->right - this->left >= n) {
        auto result = std::make_tuple(this->buffer + this->left, n);
        this->left += n;
        return result;
    } else {
        auto result = std::make_tuple(this->buffer + this->left, this->right - this->left);
        this->left = 0;
        this->right = 0;
        return result;
    }
}